

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O1

void Cbs2_ManCheckFanouts(Cbs2_Man_t *p)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  ulong uVar5;
  
  uVar1 = p->pAig->nObjs;
  if ((0 < (int)uVar1) && (p->pAig->pObjs != (Gia_Obj_t *)0x0)) {
    iVar4 = (p->vFanout0).nSize;
    uVar5 = 0;
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    do {
      if ((uint)(iVar4 * 2) == uVar5) {
LAB_006e8aa1:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (*(int *)((long)(p->vFanout0).pArray + uVar5 * 2) != 0) {
        __assert_fail("Vec_IntEntry(&p->vFanout0, iObj) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCSat2.c"
                      ,0x606,"void Cbs2_ManCheckFanouts(Cbs2_Man_t *)");
      }
      iVar2 = (p->vFanoutN).nSize;
      if (iVar2 <= (int)uVar5) goto LAB_006e8aa1;
      piVar3 = (p->vFanoutN).pArray;
      if (piVar3[uVar5] != 0) {
        __assert_fail("Vec_IntEntry(&p->vFanoutN, Abc_Var2Lit(iObj, 0)) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCSat2.c"
                      ,0x607,"void Cbs2_ManCheckFanouts(Cbs2_Man_t *)");
      }
      if (iVar2 <= (int)uVar5 + 1) goto LAB_006e8aa1;
      if (piVar3[uVar5 + 1] != 0) {
        __assert_fail("Vec_IntEntry(&p->vFanoutN, Abc_Var2Lit(iObj, 1)) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCSat2.c"
                      ,0x608,"void Cbs2_ManCheckFanouts(Cbs2_Man_t *)");
      }
      uVar5 = uVar5 + 2;
    } while ((ulong)uVar1 * 2 != uVar5);
  }
  return;
}

Assistant:

void Cbs2_ManCheckFanouts( Cbs2_Man_t * p )
{
    Gia_Obj_t * pObj;
    int iObj;
    Gia_ManForEachObj( p->pAig, pObj, iObj )
    {
        assert( Vec_IntEntry(&p->vFanout0, iObj) == 0 );
        assert( Vec_IntEntry(&p->vFanoutN, Abc_Var2Lit(iObj, 0)) == 0 );
        assert( Vec_IntEntry(&p->vFanoutN, Abc_Var2Lit(iObj, 1)) == 0 );
    }
}